

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cc
# Opt level: O0

Expression __thiscall
dynet::GRUBuilder::set_h_impl
          (GRUBuilder *this,int prev,
          vector<dynet::Expression,_std::allocator<dynet::Expression>_> *h_new)

{
  ComputationGraph *pCVar1;
  VariableIndex VVar2;
  uint uVar3;
  bool bVar4;
  size_type sVar5;
  ostream *poVar6;
  invalid_argument *this_00;
  const_reference pvVar7;
  reference this_01;
  reference pvVar8;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *in_RDX;
  long in_RDI;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *this_02;
  Expression EVar9;
  Expression h_i;
  uint i;
  uint t;
  ostringstream oss;
  value_type *in_stack_fffffffffffffd98;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *in_stack_fffffffffffffdb0;
  allocator_type *__a;
  size_type in_stack_fffffffffffffdb8;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *in_stack_fffffffffffffdc0;
  uint local_200;
  allocator_type local_1f9 [25];
  uint local_1e0;
  undefined1 local_1d9;
  string local_1d8 [48];
  ostringstream local_1a8 [376];
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *local_30;
  
  local_30 = in_RDX;
  bVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::empty
                    (in_stack_fffffffffffffdb0);
  if (!bVar4) {
    sVar5 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::size(local_30);
    if (sVar5 != *(uint *)(in_RDI + 0x134)) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar6 = std::operator<<((ostream *)local_1a8,
                               "Number of inputs passed to RNNBuilder::set_h() (");
      sVar5 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::size(local_30);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar5);
      poVar6 = std::operator<<(poVar6,") is not equal to the number of layers (");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(uint *)(in_RDI + 0x134));
      std::operator<<(poVar6,")");
      local_1d9 = 1;
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::invalid_argument::invalid_argument(this_00,local_1d8);
      local_1d9 = 0;
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  this_02 = (vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)(in_RDI + 0x100);
  sVar5 = std::
          vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
          ::size((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                  *)this_02);
  local_1e0 = (uint)sVar5;
  __a = local_1f9;
  std::allocator<dynet::Expression>::allocator((allocator<dynet::Expression> *)0x96d232);
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,__a);
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::push_back((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
               *)this_02,in_stack_fffffffffffffd98);
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::~vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)__a);
  std::allocator<dynet::Expression>::~allocator((allocator<dynet::Expression> *)0x96d26d);
  for (local_200 = 0; local_200 < *(uint *)(in_RDI + 0x134); local_200 = local_200 + 1) {
    pvVar7 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                       (local_30,(ulong)local_200);
    pCVar1 = pvVar7->pg;
    VVar2 = pvVar7->i;
    uVar3 = pvVar7->graph_id;
    this_01 = std::
              vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
              ::operator[]((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                            *)(in_RDI + 0x100),(ulong)local_1e0);
    pvVar8 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                       (this_01,(ulong)local_200);
    pvVar8->pg = pCVar1;
    pvVar8->i = VVar2;
    pvVar8->graph_id = uVar3;
  }
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::operator[]((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                *)(in_RDI + 0x100),(ulong)local_1e0);
  pvVar8 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::back(this_02);
  EVar9.pg = pvVar8->pg;
  EVar9.i = pvVar8->i;
  EVar9.graph_id = pvVar8->graph_id;
  return EVar9;
}

Assistant:

Expression GRUBuilder::set_h_impl(int prev, const vector<Expression>& h_new) {
  DYNET_ARG_CHECK(h_new.empty() || h_new.size() == layers,
                          "Number of inputs passed to RNNBuilder::set_h() (" << h_new.size() << ") "
                          "is not equal to the number of layers (" << layers << ")");
  const unsigned t = h.size();
  h.push_back(vector<Expression>(layers));
  for (unsigned i = 0; i < layers; ++i) {
    Expression h_i = h_new[i];
    h[t][i] = h_i;
  }
  return h[t].back();
}